

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Path>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *result)

{
  bool bVar1;
  allocator local_219;
  string local_218;
  undefined1 local_1f8 [8];
  Path value_1;
  int local_120;
  char nc;
  char c;
  string local_118;
  undefined1 local_f8 [8];
  Path value;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value._200_8_ = result;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    Path::Path((Path *)local_f8);
    bVar1 = ReadBasicType(this,(Path *)local_f8);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)value._200_8_,
                 (value_type *)local_f8);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_118,"Not starting with the value of requested type.\n",
                 (allocator *)&c);
      PushError(this,&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
      ::std::allocator<char>::~allocator((allocator<char> *)&c);
      this_local._7_1_ = 0;
    }
    Path::~Path((Path *)local_f8);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005535af;
        }
        bVar1 = Char1(this,&value_1.field_0xcf);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005535af;
        }
        if (value_1._207_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005535af;
          }
          bVar1 = LookChar1(this,&value_1.field_0xce);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005535af;
          }
          if (value_1._206_1_ == end_symbol) break;
        }
        if (value_1._207_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005535af;
        }
        Path::Path((Path *)local_1f8);
        bVar1 = ReadBasicType(this,(Path *)local_1f8);
        if (bVar1) {
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)value._200_8_,
                     (value_type *)local_1f8);
          local_120 = 0;
        }
        else {
          local_120 = 3;
        }
        Path::~Path((Path *)local_1f8);
      } while (local_120 == 0);
      bVar1 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::empty
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)value._200_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_218,"Empty array.\n",&local_219);
        PushError(this,&local_218);
        ::std::__cxx11::string::~string((string *)&local_218);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005535af:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}